

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::sampleTextureLayer
          (LayeredRenderCase *this,Surface *dst,int layer)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  int iVar5;
  GLenum GVar6;
  RenderContext *pRVar7;
  long lVar8;
  TestLog *this_00;
  MessageBuilder *pMVar9;
  PixelBufferAccess local_218;
  MessageBuilder local_1f0;
  undefined1 local_70 [8];
  Buffer buf;
  VertexArray vao;
  int positionLoc;
  Functions *gl;
  int local_1c;
  Surface *pSStack_18;
  int layer_local;
  Surface *dst_local;
  LayeredRenderCase *this_local;
  undefined4 extraout_var;
  
  local_1c = layer;
  pSStack_18 = dst;
  dst_local = (Surface *)this;
  if (Functional::(anonymous_namespace)::LayeredRenderCase::sampleTextureLayer(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::LayeredRenderCase::
                                 sampleTextureLayer(tcu::Surface&,int)::fullscreenQuad);
    if (iVar2 != 0) {
      tcu::Vector<float,_4>::Vector(sampleTextureLayer::fullscreenQuad,-1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTextureLayer::fullscreenQuad + 1,-1.0,1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTextureLayer::fullscreenQuad + 2,1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTextureLayer::fullscreenQuad + 3,1.0,1.0,0.0,1.0);
      __cxa_guard_release(&Functional::(anonymous_namespace)::LayeredRenderCase::
                           sampleTextureLayer(tcu::Surface&,int)::fullscreenQuad);
    }
  }
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar8 + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  uVar4 = (*pcVar1)(dVar3,"a_position");
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&buf.super_ObjectWrapper.m_object,pRVar7);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_70,pRVar7);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1f0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [29])"Sampling from texture layer ")
  ;
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f0);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  pcVar1 = *(code **)(lVar8 + 0x1a00);
  iVar2 = tcu::Vector<int,_2>::x(&this->m_resolveDimensions);
  iVar5 = tcu::Vector<int,_2>::y(&this->m_resolveDimensions);
  (*pcVar1)(0,0,iVar2,iVar5);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd4f);
  pcVar1 = *(code **)(lVar8 + 0x40);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_70);
  (*pcVar1)(0x8892,dVar3);
  (**(code **)(lVar8 + 0x150))(0x8892,0x40,sampleTextureLayer::fullscreenQuad,0x88e4);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd53);
  pcVar1 = *(code **)(lVar8 + 0xd8);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&buf.super_ObjectWrapper.m_object);
  (*pcVar1)(dVar3);
  (**(code **)(lVar8 + 0x19f0))(uVar4,4,0x1406,0,0,0);
  (**(code **)(lVar8 + 0x610))(uVar4);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd58);
  (**(code **)(lVar8 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar8 + 0xb8);
  GVar6 = getTargetTextureTarget(this->m_target);
  (*pcVar1)(GVar6,this->m_texture);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"bind texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd5c);
  pcVar1 = *(code **)(lVar8 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  (*pcVar1)(dVar3);
  (**(code **)(lVar8 + 0x14f0))(this->m_samplerLayerLoc,local_1c);
  (**(code **)(lVar8 + 0x14f0))(this->m_samplerSamplerLoc,0);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd61);
  (**(code **)(lVar8 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd64);
  (**(code **)(lVar8 + 0x1680))(0);
  (**(code **)(lVar8 + 0xd8))(0);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd68);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_218,pSStack_18);
  glu::readPixels(pRVar7,0,0,&local_218);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_70);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&buf.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void LayeredRenderCase::sampleTextureLayer (tcu::Surface& dst, int layer)
{
	DE_ASSERT(dst.getWidth() == m_resolveDimensions.x());
	DE_ASSERT(dst.getHeight() == m_resolveDimensions.y());

	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				positionLoc	= gl.getAttribLocation(m_samplerShader->getProgram(), "a_position");
	glu::VertexArray		vao			(m_context.getRenderContext());
	glu::Buffer				buf			(m_context.getRenderContext());

	m_testCtx.getLog() << tcu::TestLog::Message << "Sampling from texture layer " << layer << tcu::TestLog::EndMessage;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.viewport(0, 0, m_resolveDimensions.x(), m_resolveDimensions.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindBuffer(GL_ARRAY_BUFFER, *buf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buf");

	gl.bindVertexArray(*vao);
	gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(positionLoc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(getTargetTextureTarget(m_target), m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	gl.useProgram(m_samplerShader->getProgram());
	gl.uniform1i(m_samplerLayerLoc, layer);
	gl.uniform1i(m_samplerSamplerLoc, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup program");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	gl.useProgram(0);
	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}